

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O3

void lws_validity_cb(lws_sorted_usec_list_t *sul)

{
  lws_dll2 **wsi;
  ulong *puVar1;
  char cVar2;
  byte bVar3;
  lws_dll2 *plVar4;
  long lVar5;
  ulong uVar6;
  lws_dll2 *plVar7;
  lws_log_cx *cx;
  lws_usec_t lVar8;
  
  plVar4 = sul[-10].list.next;
  wsi = &sul[-10].list.next;
  cVar2 = *(char *)((long)&sul[0xe].list.next + 5);
  lVar5 = sul[8].us;
  uVar6 = *(ulong *)((long)&sul[0xd].cb + 6);
  cx = lwsl_wsi_get_cx((lws *)wsi);
  if ((uVar6 >> 0x28 & 1) != 0) {
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_validity_cb","validity too old");
    __lws_close_free_wsi((lws *)wsi,LWS_CLOSE_STATUS_NOSTATUS,"validity timeout");
    return;
  }
  _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_validity_cb","scheduling validity check");
  plVar7 = sul[8].list.next;
  bVar3 = *(byte *)((long)&plVar7[1].next + 1);
  if ((bVar3 & 0xf) != 0) {
    (*(code *)(&plVar7->owner->tail)[(bVar3 & 0xf) - 1])(wsi,0);
  }
  if (*(ushort *)(lVar5 + 0xc) < *(ushort *)(lVar5 + 0xe)) {
    puVar1 = (ulong *)((long)&sul[0xd].cb + 6);
    *puVar1 = *puVar1 | 0x10000000000;
    lVar8 = lws_now_usecs();
    sul->us = ((ulong)*(ushort *)(lVar5 + 0xe) - (ulong)*(ushort *)(lVar5 + 0xc)) * 1000000 + lVar8;
    __lws_sul_insert((lws_dll2_owner_t *)
                     ((long)plVar4 +
                     (ulong)((uint)((ulong)*(undefined8 *)((long)&sul[0xd].cb + 6) >> 0x2b) & 1) *
                     0x18 + (long)cVar2 * 0x1a0 + 0x2c8),sul);
    return;
  }
  __assert_fail("rbo->secs_since_valid_hangup > rbo->secs_since_valid_ping",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/wsi-timeout.c"
                ,0x13a,"void lws_validity_cb(lws_sorted_usec_list_t *)");
}

Assistant:

static void
lws_validity_cb(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws, sul_validity);
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	const lws_retry_bo_t *rbo = wsi->retry_policy;

	/* one of either the ping or hangup validity threshold was crossed */

	if (wsi->validity_hup) {
		lwsl_wsi_info(wsi, "validity too old");
		__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				     "validity timeout");
		return;
	}

	/* schedule a protocol-dependent ping */

	lwsl_wsi_info(wsi, "scheduling validity check");

	if (lws_rops_fidx(wsi->role_ops, LWS_ROPS_issue_keepalive))
		lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_issue_keepalive).
							issue_keepalive(wsi, 0);

	/*
	 * We arrange to come back here after the additional ping to hangup time
	 * and do the hangup, unless we get validated (by, eg, a PONG) and
	 * reset the timer
	 */

	assert(rbo->secs_since_valid_hangup > rbo->secs_since_valid_ping);

	wsi->validity_hup = 1;
	__lws_sul_insert_us(&pt->pt_sul_owner[!!wsi->conn_validity_wakesuspend],
			    &wsi->sul_validity,
			    ((uint64_t)rbo->secs_since_valid_hangup -
				 rbo->secs_since_valid_ping) * LWS_US_PER_SEC);
}